

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sxmlc.c
# Opt level: O1

int split_left_right(SXML_CHAR *str,SXML_CHAR sep,int *l0,int *l1,int *i_sep,int *r0,int *r1,
                    int ignore_spaces,int ignore_quotes)

{
  char cVar1;
  uint uVar2;
  uint uVar3;
  ushort **ppuVar4;
  SXML_CHAR *pSVar5;
  long lVar6;
  byte bVar7;
  int iVar8;
  long lVar9;
  byte *pbVar10;
  char *pcVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  byte bVar15;
  uint uVar16;
  
  iVar8 = 0;
  if (str != (SXML_CHAR *)0x0) {
    if (i_sep != (int *)0x0) {
      *i_sep = -1;
    }
    if (ignore_spaces == 0) {
      uVar3 = 0xffffffff;
      bVar15 = 0;
      pSVar5 = str;
      do {
        cVar1 = *pSVar5;
        uVar3 = uVar3 + 1;
        uVar12 = 0;
        ignore_quotes = 0;
        uVar16 = uVar3;
        uVar2 = 0;
        if (cVar1 == '\0') goto LAB_0010637a;
        pSVar5 = pSVar5 + 1;
      } while (cVar1 != sep);
    }
    else {
      bVar15 = *str;
      if ((char)bVar15 < '\x01') {
        uVar13 = 0;
      }
      else {
        ppuVar4 = __ctype_b_loc();
        uVar13 = 0;
        do {
          if ((*(byte *)((long)*ppuVar4 + (ulong)bVar15 * 2 + 1) & 0x20) == 0) break;
          bVar15 = str[uVar13 + 1];
          uVar13 = uVar13 + 1;
        } while ('\0' < (char)bVar15);
      }
      uVar12 = (uint)uVar13;
      if ((ignore_quotes == 0) || ((bVar15 != 0x27 && (bVar15 != 0x22)))) {
        bVar15 = str[uVar13 & 0xffffffff];
        uVar3 = uVar12;
        if (bVar15 != sep && bVar15 != 0) {
          pbVar10 = (byte *)(str + (uVar13 & 0xffffffff));
          while ((pbVar10 = pbVar10 + 1, (char)bVar15 < '\0' ||
                 (ppuVar4 = __ctype_b_loc(),
                 (*(byte *)((long)*ppuVar4 + (ulong)bVar15 * 2 + 1) & 0x20) == 0))) {
            uVar3 = uVar3 + 1;
            bVar15 = *pbVar10;
            if ((bVar15 == 0) || (bVar15 == sep)) break;
          }
        }
        bVar15 = str[uVar3];
        uVar16 = uVar3;
        if ((char)bVar15 < '\x01') {
          bVar15 = 0;
        }
        else {
          ppuVar4 = __ctype_b_loc();
          pbVar10 = (byte *)(str + uVar3);
          do {
            pbVar10 = pbVar10 + 1;
            uVar2 = uVar12;
            if ((*(byte *)((long)*ppuVar4 + (ulong)bVar15 * 2 + 1) & 0x20) == 0) break;
            uVar16 = uVar16 + 1;
            bVar15 = *pbVar10;
          } while ('\0' < (char)bVar15);
LAB_0010637a:
          uVar12 = uVar2;
          bVar15 = 0;
        }
      }
      else {
        bVar7 = str[(long)(int)uVar12 + 1];
        uVar13 = (long)(int)uVar12 + 1;
        uVar12 = (uint)uVar13;
        uVar3 = uVar12;
        if ((bVar7 != 0) && (bVar7 != bVar15)) {
          uVar13 = uVar13 & 0xffffffff;
          while ((uVar3 = (uint)uVar13, bVar7 != 0x5c ||
                 (lVar9 = (long)(int)uVar3, uVar3 = uVar3 + 1, str[lVar9 + 1] != '\0'))) {
            bVar7 = str[(long)(int)uVar3 + 1];
            uVar13 = (long)(int)uVar3 + 1;
            uVar3 = (uint)uVar13;
            if ((bVar7 == 0) || (bVar7 == bVar15)) break;
          }
        }
        lVar9 = 1;
        do {
          lVar6 = lVar9;
          cVar1 = str[lVar6 + (int)uVar3];
          if ((long)cVar1 < 1) break;
          ppuVar4 = __ctype_b_loc();
          lVar9 = lVar6 + 1;
        } while ((*(byte *)((long)*ppuVar4 + (long)cVar1 * 2 + 1) & 0x20) != 0);
        uVar16 = (int)lVar6 + uVar3;
      }
    }
    if (l0 != (int *)0x0) {
      *l0 = uVar12;
    }
    if (l1 != (int *)0x0) {
      *l1 = uVar3 - 1;
    }
    if (i_sep != (int *)0x0) {
      *i_sep = uVar16;
    }
    lVar9 = (long)(int)uVar16;
    if ((str[lVar9] == '\0') || (str[lVar9 + 1] == '\0')) {
      if (r0 != (int *)0x0) {
        *r0 = uVar16;
      }
      if (r1 != (int *)0x0) {
        *r1 = uVar16 - 1;
      }
      iVar8 = 1;
      if (i_sep != (int *)0x0) {
        *i_sep = -(uint)(str[lVar9] == '\0') | uVar16;
      }
    }
    else {
      uVar13 = lVar9 + 1;
      bVar7 = bVar15;
      if (ignore_spaces != 0) {
        bVar7 = str[uVar13];
        if ('\0' < (char)bVar7) {
          ppuVar4 = __ctype_b_loc();
          pbVar10 = (byte *)(str + (int)uVar13);
          do {
            pbVar10 = pbVar10 + 1;
            if ((*(byte *)((long)*ppuVar4 + (ulong)bVar7 * 2 + 1) & 0x20) == 0) break;
            uVar13 = (ulong)((int)uVar13 + 1);
            bVar7 = *pbVar10;
          } while ('\0' < (char)bVar7);
        }
        if ((ignore_quotes == 0) || ((bVar7 != 0x27 && (bVar7 != 0x22)))) {
          bVar7 = bVar15;
        }
      }
      bVar15 = str[(long)(int)uVar13 + 1];
      uVar14 = (long)(int)uVar13 + 1;
      uVar13 = uVar14 & 0xffffffff;
      if (bVar15 != 0) {
        uVar13 = uVar14 & 0xffffffff;
        do {
          iVar8 = (int)uVar13;
          if ((ignore_quotes != 0) && (bVar15 == bVar7)) break;
          if (bVar15 == 0x5c) {
            lVar9 = (long)iVar8;
            uVar13 = lVar9 + 1;
            iVar8 = (int)uVar13;
            if (str[lVar9 + 1] == '\0') break;
          }
          bVar15 = str[(long)iVar8 + 1];
          uVar13 = (long)iVar8 + 1;
        } while (bVar15 != 0);
      }
      if (ignore_quotes != 0) {
        if (str[(int)uVar13] != bVar7) {
          return 0;
        }
        uVar13 = (ulong)((int)uVar13 - 1);
      }
      uVar3 = (uint)uVar13;
      if (ignore_spaces == 0) {
        pcVar11 = str + (int)uVar3;
        do {
          pcVar11 = pcVar11 + 1;
          uVar3 = (int)uVar13 + 1;
          uVar13 = (ulong)uVar3;
        } while (*pcVar11 != '\0');
      }
      if (r0 != (int *)0x0) {
        *r0 = (int)uVar14;
      }
      iVar8 = 1;
      if (r1 != (int *)0x0) {
        *r1 = uVar3;
      }
    }
  }
  return iVar8;
}

Assistant:

int split_left_right(SXML_CHAR* str, SXML_CHAR sep, int* l0, int* l1, int* i_sep, int* r0, int* r1, int ignore_spaces, int ignore_quotes)
{
	int n0, n1, is;
	SXML_CHAR quote = '\0';

	if (str == NULL)
		return FALSE;

	if (i_sep != NULL)
		*i_sep = -1;

	if (!ignore_spaces) /* No sense of ignore quotes if spaces are to be kept */
		ignore_quotes = FALSE;

	/* Parse left part */

	if (ignore_spaces) {
		for (n0 = 0; str[n0] != NULC && sx_isspace(str[n0]); n0++) ; /* Skip head spaces, n0 points to first non-space */
		if (ignore_quotes && isquote(str[n0])) { /* If quote is found, look for next one */
			quote = str[n0++]; /* Quote can be '\'' or '"' */
			for (n1 = n0; str[n1] != NULC && str[n1] != quote; n1++) {
				if (str[n1] == C2SX('\\') && str[++n1] == NULC)
					break; /* Escape character (can be the last) */
			}
			for (is = n1 + 1; str[is] != NULC && sx_isspace(str[is]); is++) ; /* '--' not to take quote into account */
		} else {
			for (n1 = n0; str[n1] != NULC && str[n1] != sep && !sx_isspace(str[n1]); n1++) ; /* Search for separator or a space */
			for (is = n1; str[is] != NULC && sx_isspace(str[is]); is++) ;
		}
	} else {
		n0 = 0;
		for (n1 = 0; str[n1] != NULC && str[n1] != sep; n1++) ; /* Search for separator only */
		is = n1;
	}

	/* Here 'n0' is the start of left member, 'n1' is the character after the end of left member */

	if (l0 != NULL)
		*l0 = n0;
	if (l1 != NULL)
		*l1 = n1 - 1;
	if (i_sep != NULL)
		*i_sep = is;
	if (str[is] == NULC || str[is+1] == NULC) { /* No separator => empty right member */
		if (r0 != NULL)
			*r0 = is;
		if (r1 != NULL)
			*r1 = is-1;
		if (i_sep != NULL)
			*i_sep = (str[is] == NULC ? -1 : is);
		return TRUE;
	}

	/* Parse right part */

	n0 = is + 1;
	if (ignore_spaces) {
		for (; str[n0] != NULC && sx_isspace(str[n0]); n0++) ;
		if (ignore_quotes && isquote(str[n0]))
			quote = str[n0];
	}

	for (n1 = ++n0; str[n1]; n1++) {
		if (ignore_quotes && str[n1] == quote) /* Quote was reached */
			break;
		if (str[n1] == C2SX('\\') && str[++n1] == NULC) /* Escape character (can be the last) */
			break;
	}
	if (ignore_quotes && str[n1--] != quote) /* Quote is not the same than earlier, '--' is not to take it into account */
		return FALSE;
	if (!ignore_spaces)
		while (str[++n1]) ; /* Jump down the end of the string */

	if (r0 != NULL)
		*r0 = n0;
	if (r1 != NULL)
		*r1 = n1;

	return TRUE;
}